

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O1

vm_frameref_ext * __thiscall CVmObjFrameRef::alloc_ext(CVmObjFrameRef *this,int nlocals,int nparams)

{
  int iVar1;
  undefined4 extraout_var;
  vm_frameref_ext *pvVar2;
  
  if ((this->super_CVmObject).ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
  }
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])
                    (G_mem_X->varheap_,(long)(nlocals + nparams + -1) * 0x10 + 0x68,this);
  pvVar2 = (vm_frameref_ext *)CONCAT44(extraout_var,iVar1);
  pvVar2->nlocals = nlocals;
  pvVar2->nparams = nparams;
  (this->super_CVmObject).ext_ = (char *)pvVar2;
  return pvVar2;
}

Assistant:

vm_frameref_ext *CVmObjFrameRef::alloc_ext(VMG_ int nlocals, int nparams)
{
    /* delete any existing extension */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* figure the allocation size */
    size_t siz = sizeof(vm_frameref_ext)
                 + (nparams + nlocals - 1)*sizeof(vm_val_t);

    /* allocate the extension */
    vm_frameref_ext *ext =
        (vm_frameref_ext *)G_mem->get_var_heap()->alloc_mem(siz, this);

    /* save the variable counts */
    ext->nlocals = nlocals;
    ext->nparams = nparams;

    /* save the new extension in 'self' */
    ext_ = (char *)ext;

    /* return the new extension */
    return ext;
}